

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<long> __thiscall wasm::WATParser::Lexer::takeS<long>(Lexer *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 uVar3;
  string_view in;
  optional<long> oVar4;
  long local_40;
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)&local_40,in);
  uVar3 = &local_40;
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    bVar1 = -1 < (long)result.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                       ._M_payload._M_value.super_LexResult.span._M_str;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ == 2) {
      bVar1 = (long)result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                    ._M_payload._M_value.super_LexResult.span._M_str < 1;
    }
    uVar3 = result.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.super_LexResult.span._M_str;
    if (bVar1) {
      this->pos = this->pos + local_40;
      advance(this);
      uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00c02843;
    }
  }
  uVar2 = 0;
LAB_00c02843:
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar2;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)(_Storage<long,_true>)uVar3;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<T> Lexer::takeS() {
  static_assert(std::is_integral_v<T> && std::is_signed_v<T>);
  if (auto result = integer(next()); result && result->isSigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  return std::nullopt;
}